

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int readSuperJournal(sqlite3_file *pJrnl,char *zSuper,u32 nSuper)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  i64 szJ;
  uchar aMagic [8];
  long local_40;
  u32 local_38;
  uint local_34;
  long local_30;
  
  *zSuper = '\0';
  iVar1 = (*pJrnl->pMethods->xFileSize)(pJrnl,&local_40);
  if ((0xf < local_40 && iVar1 == 0) &&
     (iVar1 = read32bits(pJrnl,local_40 + -0x10,&local_34), iVar1 == 0)) {
    uVar3 = (ulong)local_34;
    iVar1 = 0;
    if (((local_34 < nSuper) &&
        (((iVar1 = 0, uVar3 != 0 && (long)uVar3 <= local_40 + -0x10 &&
          (iVar1 = read32bits(pJrnl,local_40 + -0xc,&local_38), iVar1 == 0)) &&
         (iVar1 = (*pJrnl->pMethods->xRead)(pJrnl,&local_30,8,local_40 + -8), iVar1 == 0)))) &&
       ((iVar1 = 0, local_30 == -0x289c5edf06fa2a27 &&
        (iVar1 = (*pJrnl->pMethods->xRead)(pJrnl,zSuper,local_34,(local_40 - uVar3) + -0x10),
        iVar1 == 0)))) {
      uVar2 = 0;
      do {
        local_38 = local_38 - (int)zSuper[uVar2];
        uVar2 = uVar2 + 1;
      } while (uVar3 != uVar2);
      iVar1 = 0;
      if (local_38 != 0) {
        uVar3 = 0;
      }
      zSuper[uVar3] = '\0';
      zSuper[(int)uVar3 + 1] = '\0';
    }
  }
  return iVar1;
}

Assistant:

static int readSuperJournal(sqlite3_file *pJrnl, char *zSuper, u32 nSuper){
  int rc;                    /* Return code */
  u32 len;                   /* Length in bytes of super-journal name */
  i64 szJ;                   /* Total size in bytes of journal file pJrnl */
  u32 cksum;                 /* MJ checksum value read from journal */
  u32 u;                     /* Unsigned loop counter */
  unsigned char aMagic[8];   /* A buffer to hold the magic header */
  zSuper[0] = '\0';

  if( SQLITE_OK!=(rc = sqlite3OsFileSize(pJrnl, &szJ))
   || szJ<16
   || SQLITE_OK!=(rc = read32bits(pJrnl, szJ-16, &len))
   || len>=nSuper
   || len>szJ-16
   || len==0
   || SQLITE_OK!=(rc = read32bits(pJrnl, szJ-12, &cksum))
   || SQLITE_OK!=(rc = sqlite3OsRead(pJrnl, aMagic, 8, szJ-8))
   || memcmp(aMagic, aJournalMagic, 8)
   || SQLITE_OK!=(rc = sqlite3OsRead(pJrnl, zSuper, len, szJ-16-len))
  ){
    return rc;
  }

  /* See if the checksum matches the super-journal name */
  for(u=0; u<len; u++){
    cksum -= zSuper[u];
  }
  if( cksum ){
    /* If the checksum doesn't add up, then one or more of the disk sectors
    ** containing the super-journal filename is corrupted. This means
    ** definitely roll back, so just return SQLITE_OK and report a (nul)
    ** super-journal filename.
    */
    len = 0;
  }
  zSuper[len] = '\0';
  zSuper[len+1] = '\0';

  return SQLITE_OK;
}